

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiViewportP *
ImGui::AddUpdateViewport
          (ImGuiWindow *window,ImGuiID id,ImVec2 *pos,ImVec2 *size,ImGuiViewportFlags flags)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  ImVec2 IVar4;
  ImGuiViewportP **ppIVar5;
  ImGuiContext *pIVar6;
  long lVar7;
  ImGuiViewportP *this;
  ImGuiViewportP **__dest;
  int iVar8;
  int iVar9;
  long lVar10;
  ImGuiContext *g;
  uint uVar11;
  float fVar12;
  float fVar13;
  
  pIVar6 = GImGui;
  if (id == 0) {
    __assert_fail("id != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x2c3c,
                  "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                 );
  }
  if (window != (ImGuiWindow *)0x0) {
    if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && (GImGui->MovingWindow->RootWindow == window)
       ) {
      flags = flags | 0x14;
    }
    uVar11 = flags | 0x10;
    if ((~window->Flags & 0x40200U) != 0) {
      uVar11 = flags;
    }
    flags = (uint)window->Flags >> 10 & 4 | uVar11;
  }
  lVar7 = (long)(GImGui->Viewports).Size;
  if (0 < lVar7) {
    lVar10 = 0;
    do {
      this = (GImGui->Viewports).Data[lVar10];
      if ((this->super_ImGuiViewport).ID == id) goto LAB_00133521;
      lVar10 = lVar10 + 1;
    } while (lVar7 != lVar10);
  }
  this = (ImGuiViewportP *)0x0;
LAB_00133521:
  if (this == (ImGuiViewportP *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0x130,GImAllocatorUserData);
    ImGuiViewportP::ImGuiViewportP(this);
    (this->super_ImGuiViewport).ID = id;
    *(int *)&(this->super_ImGuiViewport).field_0x64 = (pIVar6->Viewports).Size;
    IVar4 = *pos;
    this->LastPos = IVar4;
    (this->super_ImGuiViewport).Pos = IVar4;
    (this->super_ImGuiViewport).Size = *size;
    (this->super_ImGuiViewport).Flags = flags;
    UpdateViewportPlatformMonitor(this);
    iVar9 = (pIVar6->Viewports).Size;
    iVar3 = (pIVar6->Viewports).Capacity;
    if (iVar9 == iVar3) {
      iVar9 = iVar9 + 1;
      if (iVar3 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar3 / 2 + iVar3;
      }
      if (iVar9 < iVar8) {
        iVar9 = iVar8;
      }
      if (iVar3 < iVar9) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        __dest = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar9 << 3,GImAllocatorUserData);
        ppIVar5 = (pIVar6->Viewports).Data;
        if (ppIVar5 != (ImGuiViewportP **)0x0) {
          memcpy(__dest,ppIVar5,(long)(pIVar6->Viewports).Size << 3);
          ppIVar5 = (pIVar6->Viewports).Data;
          if ((ppIVar5 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
        }
        (pIVar6->Viewports).Data = __dest;
        (pIVar6->Viewports).Capacity = iVar9;
      }
    }
    (pIVar6->Viewports).Data[(pIVar6->Viewports).Size] = this;
    (pIVar6->Viewports).Size = (pIVar6->Viewports).Size + 1;
    fVar12 = (this->super_ImGuiViewport).Pos.x;
    fVar13 = (pIVar6->DrawListSharedData).ClipRectFullscreen.x;
    fVar2 = (pIVar6->DrawListSharedData).ClipRectFullscreen.y;
    if (fVar12 <= fVar13) {
      fVar13 = fVar12;
    }
    (pIVar6->DrawListSharedData).ClipRectFullscreen.x = fVar13;
    fVar13 = (this->super_ImGuiViewport).Pos.y;
    if (fVar13 <= fVar2) {
      fVar2 = fVar13;
    }
    (pIVar6->DrawListSharedData).ClipRectFullscreen.y = fVar2;
    fVar12 = fVar12 + (this->super_ImGuiViewport).Size.x;
    fVar2 = (pIVar6->DrawListSharedData).ClipRectFullscreen.z;
    uVar11 = -(uint)(fVar12 <= fVar2);
    (pIVar6->DrawListSharedData).ClipRectFullscreen.z =
         (float)(uVar11 & (uint)fVar2 | ~uVar11 & (uint)fVar12);
    fVar12 = (pIVar6->DrawListSharedData).ClipRectFullscreen.w;
    fVar13 = fVar13 + (this->super_ImGuiViewport).Size.y;
    uVar11 = -(uint)(fVar13 <= fVar12);
    (pIVar6->DrawListSharedData).ClipRectFullscreen.w =
         (float)(uVar11 & (uint)fVar12 | ~uVar11 & (uint)fVar13);
    uVar11 = (uint)this->PlatformMonitor;
    if (uVar11 != 0xffffffff) {
      if ((this->PlatformMonitor < 0) || ((pIVar6->PlatformIO).Monitors.Size <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/include/imgui.h"
                      ,0x5c2,
                      "T &ImVector<ImGuiPlatformMonitor>::operator[](int) [T = ImGuiPlatformMonitor]"
                     );
      }
      (this->super_ImGuiViewport).DpiScale = (pIVar6->PlatformIO).Monitors.Data[uVar11].DpiScale;
    }
  }
  else {
    if ((this->super_ImGuiViewport).PlatformRequestMove == false) {
      (this->super_ImGuiViewport).Pos = *pos;
    }
    if ((this->super_ImGuiViewport).PlatformRequestResize == false) {
      (this->super_ImGuiViewport).Size = *size;
    }
    (this->super_ImGuiViewport).Flags = (this->super_ImGuiViewport).Flags & 0x80U | flags;
  }
  this->Window = window;
  this->LastFrameActive = pIVar6->FrameCount;
  if (window != (ImGuiWindow *)0x0) {
    if ((this->super_ImGuiViewport).ID != window->ID) {
      __assert_fail("window == __null || viewport->ID == window->ID",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x2c6d,
                    "ImGuiViewportP *ImGui::AddUpdateViewport(ImGuiWindow *, ImGuiID, const ImVec2 &, const ImVec2 &, ImGuiViewportFlags)"
                   );
    }
    if (window != (ImGuiWindow *)0x0) {
      window->ViewportOwned = true;
    }
  }
  return this;
}

Assistant:

ImGuiViewportP* ImGui::AddUpdateViewport(ImGuiWindow* window, ImGuiID id, const ImVec2& pos, const ImVec2& size, ImGuiViewportFlags flags)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    if (window != NULL)
    {
        if (g.MovingWindow && g.MovingWindow->RootWindow == window)
            flags |= ImGuiViewportFlags_NoInputs | ImGuiViewportFlags_NoFocusOnAppearing;
        if ((window->Flags & ImGuiWindowFlags_NoMouseInputs) && (window->Flags & ImGuiWindowFlags_NoNavInputs))
            flags |= ImGuiViewportFlags_NoInputs;
        if (window->Flags & ImGuiWindowFlags_NoFocusOnAppearing)
            flags |= ImGuiViewportFlags_NoFocusOnAppearing;
    }

    ImGuiViewportP* viewport = (ImGuiViewportP*)FindViewportByID(id);
    if (viewport)
    {
        if (!viewport->PlatformRequestMove)
            viewport->Pos = pos;
        if (!viewport->PlatformRequestResize)
            viewport->Size = size;
        viewport->Flags = flags | (viewport->Flags & ImGuiViewportFlags_Minimized); // Preserve existing flags
    }
    else
    {
        // New viewport
        viewport = IM_NEW(ImGuiViewportP)();
        viewport->ID = id;
        viewport->Idx = g.Viewports.Size;
        viewport->Pos = viewport->LastPos = pos;
        viewport->Size = size;
        viewport->Flags = flags;
        UpdateViewportPlatformMonitor(viewport);
        g.Viewports.push_back(viewport);
        IMGUI_DEBUG_LOG_VIEWPORT("Add Viewport %08X (%s)\n", id, window->Name);

        // We normally setup for all viewports in NewFrame() but here need to handle the mid-frame creation of a new viewport.
        // We need to extend the fullscreen clip rect so the OverlayDrawList clip is correct for that the first frame
        g.DrawListSharedData.ClipRectFullscreen.x = ImMin(g.DrawListSharedData.ClipRectFullscreen.x, viewport->Pos.x);
        g.DrawListSharedData.ClipRectFullscreen.y = ImMin(g.DrawListSharedData.ClipRectFullscreen.y, viewport->Pos.y);
        g.DrawListSharedData.ClipRectFullscreen.z = ImMax(g.DrawListSharedData.ClipRectFullscreen.z, viewport->Pos.x + viewport->Size.x);
        g.DrawListSharedData.ClipRectFullscreen.w = ImMax(g.DrawListSharedData.ClipRectFullscreen.w, viewport->Pos.y + viewport->Size.y);

        // Store initial DpiScale before the OS platform window creation, based on expected monitor data.
        // This is so we can select an appropriate font size on the first frame of our window lifetime
        if (viewport->PlatformMonitor != -1)
            viewport->DpiScale = g.PlatformIO.Monitors[viewport->PlatformMonitor].DpiScale;
    }

    viewport->Window = window;
    viewport->LastFrameActive = g.FrameCount;
    IM_ASSERT(window == NULL || viewport->ID == window->ID);

    if (window != NULL)
        window->ViewportOwned = true;

    return viewport;
}